

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printPartStats(ostream *out,partStats *data,string *indent,int timing,bool raw,bool stats)

{
  bool bVar1;
  ostream *poVar2;
  uint in_ECX;
  string *in_RDX;
  long in_RSI;
  ostream *in_RDI;
  bool output;
  bool in_stack_00000046;
  bool in_stack_00000047;
  ostream *in_stack_00000048;
  vector<double,_std::allocator<double>_> *in_stack_00000050;
  
  bVar1 = false;
  if ((in_ECX & 1) != 0) {
    if ((*(byte *)(in_RSI + 0x98) & 1) != 0) {
      poVar2 = std::operator<<(in_RDI,in_RDX);
      std::operator<<(poVar2,"\"count read time\": ");
      printTiming(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000046);
      std::operator<<(in_RDI,",\n");
    }
    poVar2 = std::operator<<(in_RDI,in_RDX);
    std::operator<<(poVar2,"\"read time\": ");
    printTiming(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000046);
    bVar1 = true;
  }
  if ((in_ECX & 2) != 0) {
    if (bVar1) {
      std::operator<<(in_RDI,",\n");
    }
    bVar1 = true;
    poVar2 = std::operator<<(in_RDI,in_RDX);
    std::operator<<(poVar2,"\"write time\": ");
    printTiming(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000046);
  }
  if ((in_ECX & 4) != 0) {
    if ((*(byte *)(in_RSI + 0x98) & 1) != 0) {
      if (bVar1) {
        std::operator<<(in_RDI,",\n");
      }
      bVar1 = true;
      poVar2 = std::operator<<(in_RDI,in_RDX);
      std::operator<<(poVar2,"\"count re-read time\": ");
      printTiming(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000046);
    }
    if (bVar1) {
      std::operator<<(in_RDI,",\n");
    }
    poVar2 = std::operator<<(in_RDI,in_RDX);
    std::operator<<(poVar2,"\"re-read time\": ");
    printTiming(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000046);
  }
  return;
}

Assistant:

void
printPartStats (
    ostream&         out,
    const partStats& data,
    const string     indent,
    int              timing,
    bool             raw,
    bool             stats)
{
    bool output = false;
    if (timing & options::TIME_READ)
    {
        if (data.sizeData.isDeep)
        {
            out << indent << "\"count read time\": ";
            printTiming (data.countReadPerf, out, raw, stats);
            output = true;
        }
        if (output) { out << ",\n"; }
        out << indent << "\"read time\": ";
        printTiming (data.readPerf, out, raw, stats);
        output = true;
    }

    if (timing & options::TIME_WRITE)
    {
        if (output) { out << ",\n"; }
        output = true;
        out << indent << "\"write time\": ";
        printTiming (data.writePerf, out, raw, stats);
    }

    if (timing & options::TIME_REREAD)
    {
        if (data.sizeData.isDeep)
        {
            if (output) { out << ",\n"; }
            output = true;
            out << indent << "\"count re-read time\": ";
            printTiming (data.countRereadPerf, out, raw, stats);
        }
        if (output) { out << ",\n"; }
        output = true;
        out << indent << "\"re-read time\": ";
        printTiming (data.rereadPerf, out, raw, stats);
    }
}